

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

GeoPoly * geopolyBBox(sqlite3_context *context,sqlite3_value *pPoly,RtreeCoord *aCoord,int *pRc)

{
  int iVar1;
  GeoPoly *p;
  GeoPoly *pGVar2;
  long lVar3;
  RtreeCoord RVar4;
  RtreeCoord RVar5;
  RtreeCoord RVar6;
  RtreeCoord RVar7;
  RtreeCoord RVar8;
  RtreeCoord local_4c;
  undefined8 local_48;
  
  if (aCoord == (RtreeCoord *)0x0 || pPoly != (sqlite3_value *)0x0) {
    p = geopolyFuncParam(context,pPoly,pRc);
    if (p == (GeoPoly *)0x0) {
      if (aCoord == (RtreeCoord *)0x0) {
        return (GeoPoly *)0x0;
      }
      *(undefined8 *)aCoord = 0;
      *(undefined8 *)(aCoord + 2) = 0;
      return (GeoPoly *)0x0;
    }
    RVar7.i = (int)*(undefined8 *)p->a;
    RVar6.i = (int)((ulong)*(undefined8 *)p->a >> 0x20);
    RVar5.i = RVar6.i;
    local_4c.i = RVar7.i;
    if (1 < (long)p->nVertex) {
      lVar3 = 0;
      RVar4.i = RVar6.i;
      RVar8.i = RVar7.i;
      do {
        RVar5 = (RtreeCoord)((RtreeCoord *)(p->a + lVar3 * 2 + 2))->f;
        local_4c = RVar5;
        if ((RVar8.f <= RVar5.f) && (local_4c = RVar8, RVar7.f < RVar5.f)) {
          RVar7 = RVar5;
        }
        RVar8 = (RtreeCoord)((RtreeCoord *)(p->a + lVar3 * 2 + 3))->f;
        RVar5 = RVar8;
        if ((RVar4.f <= RVar8.f) && (RVar5 = RVar4, RVar6.f < RVar8.f)) {
          RVar6 = RVar8;
        }
        lVar3 = lVar3 + 1;
        RVar4 = RVar5;
        RVar8 = local_4c;
      } while ((long)p->nVertex + -1 != lVar3);
    }
    if (pRc != (int *)0x0) {
      *pRc = 0;
    }
    local_48 = CONCAT44(RVar5.i,RVar7.i);
    if (aCoord != (RtreeCoord *)0x0) {
      sqlite3_free(p);
      aCoord->f = (RtreeValue)local_4c;
      *(undefined8 *)(aCoord + 1) = local_48;
      aCoord[3].f = (RtreeValue)RVar6;
      return (GeoPoly *)0x0;
    }
  }
  else {
    local_4c = *aCoord;
    local_48 = *(undefined8 *)(aCoord + 1);
    RVar6 = aCoord[3];
    p = (GeoPoly *)0x0;
  }
  iVar1 = sqlite3_initialize();
  if ((iVar1 == 0) && (pGVar2 = (GeoPoly *)sqlite3Realloc(p,0x28), pGVar2 != (GeoPoly *)0x0)) {
    pGVar2->nVertex = 4;
    pGVar2->hdr[0] = '\x01';
    pGVar2->hdr[1] = '\0';
    pGVar2->hdr[2] = '\0';
    pGVar2->hdr[3] = '\x04';
    pGVar2->a[0] = (GeoCoord)local_4c;
    pGVar2->a[1] = local_48._4_4_;
    pGVar2->a[2] = (GeoCoord)local_48;
    pGVar2->a[3] = local_48._4_4_;
    pGVar2->a[4] = (GeoCoord)local_48;
    *(RtreeCoord *)(pGVar2->a + 5) = RVar6;
    *(RtreeCoord *)(pGVar2->a + 6) = local_4c;
    *(RtreeCoord *)(pGVar2->a + 7) = RVar6;
    return pGVar2;
  }
  sqlite3_free(p);
  if (context != (sqlite3_context *)0x0) {
    sqlite3_result_error_nomem(context);
  }
  if (pRc != (int *)0x0) {
    *pRc = 7;
  }
  return (GeoPoly *)0x0;
}

Assistant:

static GeoPoly *geopolyBBox(
  sqlite3_context *context,   /* For recording the error */
  sqlite3_value *pPoly,       /* The polygon */
  RtreeCoord *aCoord,         /* Results here */
  int *pRc                    /* Error code here */
){
  GeoPoly *pOut = 0;
  GeoPoly *p;
  float mnX, mxX, mnY, mxY;
  if( pPoly==0 && aCoord!=0 ){
    p = 0;
    mnX = aCoord[0].f;
    mxX = aCoord[1].f;
    mnY = aCoord[2].f;
    mxY = aCoord[3].f;
    goto geopolyBboxFill;
  }else{
    p = geopolyFuncParam(context, pPoly, pRc);
  }
  if( p ){
    int ii;
    mnX = mxX = GeoX(p,0);
    mnY = mxY = GeoY(p,0);
    for(ii=1; ii<p->nVertex; ii++){
      double r = GeoX(p,ii);
      if( r<mnX ) mnX = (float)r;
      else if( r>mxX ) mxX = (float)r;
      r = GeoY(p,ii);
      if( r<mnY ) mnY = (float)r;
      else if( r>mxY ) mxY = (float)r;
    }
    if( pRc ) *pRc = SQLITE_OK;
    if( aCoord==0 ){
      geopolyBboxFill:
      pOut = sqlite3_realloc64(p, GEOPOLY_SZ(4));
      if( pOut==0 ){
        sqlite3_free(p);
        if( context ) sqlite3_result_error_nomem(context);
        if( pRc ) *pRc = SQLITE_NOMEM;
        return 0;
      }
      pOut->nVertex = 4;
      ii = 1;
      pOut->hdr[0] = *(unsigned char*)&ii;
      pOut->hdr[1] = 0;
      pOut->hdr[2] = 0;
      pOut->hdr[3] = 4;
      GeoX(pOut,0) = mnX;
      GeoY(pOut,0) = mnY;
      GeoX(pOut,1) = mxX;
      GeoY(pOut,1) = mnY;
      GeoX(pOut,2) = mxX;
      GeoY(pOut,2) = mxY;
      GeoX(pOut,3) = mnX;
      GeoY(pOut,3) = mxY;
    }else{
      sqlite3_free(p);
      aCoord[0].f = mnX;
      aCoord[1].f = mxX;
      aCoord[2].f = mnY;
      aCoord[3].f = mxY;
    }
  }else if( aCoord ){
    memset(aCoord, 0, sizeof(RtreeCoord)*4);
  }
  return pOut;
}